

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  undefined8 uVar4;
  GCObject *pGVar5;
  bool bVar6;
  undefined8 uVar7;
  int iVar8;
  char *pcVar9;
  Value *pVVar10;
  long *plVar11;
  int *piVar12;
  unsigned_long *puVar13;
  undefined1 (*__s) [32];
  char *pcVar14;
  size_t sVar15;
  undefined8 *puVar16;
  undefined1 auVar17 [32];
  TValue num;
  BuffFS buff;
  Value local_1e0;
  char local_1d8 [8];
  BuffFS local_1d0;
  
  local_1d0.pushed = 0;
  local_1d0.blen = 0;
  local_1d0.L = L;
  pcVar9 = strchr(fmt,0x25);
  if (pcVar9 != (char *)0x0) {
    do {
      addstr2buff(&local_1d0,fmt,(long)pcVar9 - (long)fmt);
      bVar1 = pcVar9[1];
      if (bVar1 < 100) {
        if (bVar1 < 0x55) {
          if (bVar1 != 0x25) {
            if (bVar1 != 0x49) {
LAB_00132717:
              luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                            (ulong)(uint)(int)(char)bVar1);
            }
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              pVVar10 = (Value *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              pVVar10 = (Value *)argp->overflow_arg_area;
              argp->overflow_arg_area = pVVar10 + 1;
            }
            local_1e0 = *pVVar10;
LAB_001325d8:
            local_1d8[0] = '\x13';
            local_1d8[1] = '\0';
            goto LAB_00132603;
          }
          pcVar14 = getbuff(&local_1d0,1);
          *pcVar14 = '%';
        }
        else {
          if (bVar1 == 0x55) {
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              puVar13 = (unsigned_long *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              puVar13 = (unsigned_long *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar13 + 1;
            }
            iVar8 = luaO_utf8esc((char *)&local_1e0.b,*puVar13);
            sVar15 = (size_t)iVar8;
            pcVar14 = local_1d8 + -sVar15;
LAB_00132674:
            addstr2buff(&local_1d0,pcVar14,sVar15);
            goto LAB_00132679;
          }
          if (bVar1 != 99) goto LAB_00132717;
          uVar3 = argp->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            pcVar14 = (char *)((ulong)uVar3 + (long)argp->reg_save_area);
            argp->gp_offset = uVar3 + 8;
          }
          else {
            pcVar14 = (char *)argp->overflow_arg_area;
            argp->overflow_arg_area = pcVar14 + 8;
          }
          cVar2 = *pcVar14;
          pcVar14 = getbuff(&local_1d0,1);
          *pcVar14 = cVar2;
        }
        local_1d0.blen = local_1d0.blen + 1;
      }
      else {
        if (bVar1 < 0x70) {
          if (bVar1 == 100) {
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              piVar12 = (int *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              piVar12 = (int *)argp->overflow_arg_area;
              argp->overflow_arg_area = piVar12 + 2;
            }
            local_1e0 = (Value)(long)*piVar12;
            goto LAB_001325d8;
          }
          if (bVar1 != 0x66) goto LAB_00132717;
          uVar3 = argp->fp_offset;
          if ((ulong)uVar3 < 0xa1) {
            pVVar10 = (Value *)((ulong)uVar3 + (long)argp->reg_save_area);
            argp->fp_offset = uVar3 + 0x10;
          }
          else {
            pVVar10 = (Value *)argp->overflow_arg_area;
            argp->overflow_arg_area = pVVar10 + 1;
          }
          local_1e0 = *pVVar10;
          local_1d8[0] = '\x03';
          local_1d8[1] = '\0';
LAB_00132603:
          pcVar14 = getbuff(&local_1d0,0x32);
          iVar8 = tostringbuff((TValue *)&local_1e0,pcVar14);
        }
        else {
          if (bVar1 != 0x70) {
            if (bVar1 != 0x73) goto LAB_00132717;
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              plVar11 = (long *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              plVar11 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar11 + 1;
            }
            pcVar14 = (char *)*plVar11;
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "(null)";
            }
            sVar15 = strlen(pcVar14);
            goto LAB_00132674;
          }
          __s = (undefined1 (*) [32])getbuff(&local_1d0,0x20);
          uVar3 = argp->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar16 = (undefined8 *)((ulong)uVar3 + (long)argp->reg_save_area);
            argp->gp_offset = uVar3 + 8;
          }
          else {
            puVar16 = (undefined8 *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar16 + 1;
          }
          uVar4 = *puVar16;
          auVar17[8] = 0xab;
          auVar17._0_8_ = 0xabababababababab;
          auVar17[9] = 0xab;
          auVar17[10] = 0xab;
          auVar17[0xb] = 0xab;
          auVar17[0xc] = 0xab;
          auVar17[0xd] = 0xab;
          auVar17[0xe] = 0xab;
          auVar17[0xf] = 0xab;
          auVar17[0x10] = 0xab;
          auVar17[0x11] = 0xab;
          auVar17[0x12] = 0xab;
          auVar17[0x13] = 0xab;
          auVar17[0x14] = 0xab;
          auVar17[0x15] = 0xab;
          auVar17[0x16] = 0xab;
          auVar17[0x17] = 0xab;
          auVar17[0x18] = 0xab;
          auVar17[0x19] = 0xab;
          auVar17[0x1a] = 0xab;
          auVar17[0x1b] = 0xab;
          auVar17[0x1c] = 0xab;
          auVar17[0x1d] = 0xab;
          auVar17[0x1e] = 0xab;
          auVar17[0x1f] = 0xab;
          *__s = auVar17;
          iVar8 = snprintf((char *)__s,0x20,"%p",uVar4);
        }
        local_1d0.blen = local_1d0.blen + iVar8;
      }
LAB_00132679:
      fmt = pcVar9 + 2;
      pcVar9 = strchr(fmt,0x25);
    } while (pcVar9 != (char *)0x0);
  }
  sVar15 = strlen(fmt);
  addstr2buff(&local_1d0,fmt,sVar15);
  pushstr(&local_1d0,local_1d0.space,(long)local_1d0.blen);
  uVar4 = local_1d0._8_8_;
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffff;
  uVar7 = local_1d0._8_8_;
  local_1d0.pushed = (int)uVar4;
  iVar8 = local_1d0.pushed;
  bVar6 = 1 < local_1d0.pushed;
  local_1d0._8_8_ = uVar7;
  if (bVar6) {
    luaV_concat(L,iVar8);
  }
  if ((L->top[-1].tt_ & 0xf) == 4) {
    pGVar5 = L->top[-1].value_.gc;
    if ((pGVar5->tt & 0xf) == 4) {
      return (char *)&pGVar5[1].tt;
    }
    pcVar9 = "(((((L->top - 1)->value_).gc)->tt) & 0x0F) == 4";
  }
  else {
    pcVar9 = "(((((((L->top - 1))->tt_)) & 0x0F)) == (4))";
  }
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                ,0x22c,
                "const char *luaO_pushvfstring(lua_State *, const char *, struct __va_list_tag *)");
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  BuffFS buff;  /* holds last part of the result */
  const char *e;  /* points to next '%' */
  buff.pushed = buff.blen = 0;
  buff.L = L;
  while ((e = strchr(fmt, '%')) != NULL) {
    addstr2buff(&buff, fmt, e - fmt);  /* add 'fmt' up to '%' */
    switch (*(e + 1)) {  /* conversion specifier */
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        addstr2buff(&buff, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char c = cast_uchar(va_arg(argp, int));
        addstr2buff(&buff, &c, sizeof(char));
        break;
      }
      case 'd': {  /* an 'int' */
        TValue num;
        setivalue(&num, va_arg(argp, int));
        addnum2buff(&buff, &num);
        break;
      }
      case 'I': {  /* a 'lua_Integer' */
        TValue num;
        setivalue(&num, cast(lua_Integer, va_arg(argp, l_uacInt)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'f': {  /* a 'lua_Number' */
        TValue num;
        setfltvalue(&num, cast_num(va_arg(argp, l_uacNumber)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'p': {  /* a pointer */
        const int sz = 3 * sizeof(void*) + 8; /* enough space for '%p' */
        char *bf = getbuff(&buff, sz);
        void *p = va_arg(argp, void *);
        int len = lua_pointer2str(bf, sz, p);
        addsize(&buff, len);
        break;
      }
      case 'U': {  /* a 'long' as a UTF-8 sequence */
        char bf[UTF8BUFFSZ];
        int len = luaO_utf8esc(bf, va_arg(argp, long));
        addstr2buff(&buff, bf + UTF8BUFFSZ - len, len);
        break;
      }
      case '%': {
        addstr2buff(&buff, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    fmt = e + 2;  /* skip '%' and the specifier */
  }
  addstr2buff(&buff, fmt, strlen(fmt));  /* rest of 'fmt' */
  clearbuff(&buff);  /* empty buffer into the stack */
  if (buff.pushed > 1)
    luaV_concat(L, buff.pushed);  /* join all partial results */
  return svalue(L->top - 1);
}